

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

OPJ_BOOL opj_pi_next_rpcl(opj_pi_iterator_t *pi)

{
  char cVar1;
  OPJ_INT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  uint uVar6;
  uint uVar7;
  opj_pi_comp_t *poVar8;
  opj_pi_resolution_t *poVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  OPJ_UINT32 local_70;
  OPJ_UINT32 local_68;
  OPJ_INT32 prcj;
  OPJ_INT32 prci;
  OPJ_UINT32 rpy;
  OPJ_UINT32 rpx;
  OPJ_INT32 try1;
  OPJ_INT32 trx1;
  OPJ_INT32 try0;
  OPJ_INT32 trx0;
  OPJ_UINT32 levelno;
  OPJ_UINT32 dy;
  OPJ_UINT32 dx;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 index;
  opj_pi_resolution_t *res;
  opj_pi_comp_t *comp;
  opj_pi_iterator_t *pi_local;
  
  if (pi->first == 0) {
    do {
      pi->layno = pi->layno + 1;
      while ((pi->poc).layno1 <= pi->layno) {
        do {
          do {
            do {
              pi->compno = pi->compno + 1;
              while ((pi->poc).compno1 <= pi->compno) {
                pi->x = (pi->dx - pi->x % (int)pi->dx) + pi->x;
                while ((pi->poc).tx1 <= pi->x) {
                  pi->y = (pi->dy - pi->y % (int)pi->dy) + pi->y;
                  while ((pi->poc).ty1 <= pi->y) {
                    pi->resno = pi->resno + 1;
LAB_0013ab15:
                    if ((pi->poc).resno1 <= pi->resno) {
                      return 0;
                    }
                    pi->y = (pi->poc).ty0;
                  }
                  pi->x = (pi->poc).tx0;
                }
                pi->compno = (pi->poc).compno0;
              }
              poVar8 = pi->comps + pi->compno;
            } while (poVar8->numresolutions <= pi->resno);
            poVar9 = poVar8->resolutions + pi->resno;
            uVar7 = (poVar8->numresolutions - 1) - pi->resno;
          } while ((((0x1f < uVar7) ||
                    (bVar10 = (byte)uVar7,
                    (poVar8->dx << (bVar10 & 0x1f)) >> (bVar10 & 0x1f) != poVar8->dx)) ||
                   ((poVar8->dy << (bVar10 & 0x1f)) >> (bVar10 & 0x1f) != poVar8->dy)) ||
                  ((0x7fffffff < poVar8->dx << (bVar10 & 0x1f) ||
                   (0x7fffffff < poVar8->dy << (bVar10 & 0x1f)))));
          OVar2 = opj_int_ceildiv(pi->tx0,poVar8->dx << (bVar10 & 0x1f));
          OVar3 = opj_int_ceildiv(pi->ty0,poVar8->dy << (bVar10 & 0x1f));
          OVar4 = opj_int_ceildiv(pi->tx1,poVar8->dx << (bVar10 & 0x1f));
          OVar5 = opj_int_ceildiv(pi->ty1,poVar8->dy << (bVar10 & 0x1f));
          uVar6 = poVar9->pdx + uVar7;
          uVar7 = poVar9->pdy + uVar7;
        } while (((((0x1e < uVar6) ||
                   ((bVar11 = (byte)uVar6,
                    (poVar8->dx << (bVar11 & 0x1f)) >> (bVar11 & 0x1f) != poVar8->dx ||
                    (0x1e < uVar7)))) ||
                  ((bVar12 = (byte)uVar7,
                   (poVar8->dy << (bVar12 & 0x1f)) >> (bVar12 & 0x1f) != poVar8->dy ||
                   ((pi->y % (int)(poVar8->dy << (bVar12 & 0x1f)) != 0 &&
                    ((pi->y != pi->ty0 || ((OVar3 << (bVar10 & 0x1f)) % (1 << (bVar12 & 0x1f)) == 0)
                     ))))))) ||
                 ((pi->x % (int)(poVar8->dx << (bVar11 & 0x1f)) != 0 &&
                  ((pi->x != pi->tx0 || ((OVar2 << (bVar10 & 0x1f)) % (1 << (bVar11 & 0x1f)) == 0)))
                  ))) || ((poVar9->pw == 0 ||
                          (((poVar9->ph == 0 || (OVar2 == OVar4)) || (OVar3 == OVar5))))));
        OVar4 = opj_int_ceildiv(pi->x,poVar8->dx << (bVar10 & 0x1f));
        OVar4 = opj_int_floordivpow2(OVar4,poVar9->pdx);
        OVar2 = opj_int_floordivpow2(OVar2,poVar9->pdx);
        OVar5 = opj_int_ceildiv(pi->y,poVar8->dy << (bVar10 & 0x1f));
        OVar5 = opj_int_floordivpow2(OVar5,poVar9->pdy);
        OVar3 = opj_int_floordivpow2(OVar3,poVar9->pdy);
        pi->precno = (OVar4 - OVar2) + (OVar5 - OVar3) * poVar9->pw;
        pi->layno = (pi->poc).layno0;
      }
      uVar7 = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno * pi->step_c +
              pi->precno * pi->step_p;
      if (pi->include_size <= uVar7) {
        opj_pi_emit_error(pi,"Invalid access to pi->include");
        return 0;
      }
    } while (pi->include[uVar7] != 0);
    pi->include[uVar7] = 1;
    pi_local._4_4_ = 1;
  }
  else {
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    for (dx = 0; dx < pi->numcomps; dx = dx + 1) {
      poVar8 = pi->comps + dx;
      for (dy = 0; dy < poVar8->numresolutions; dy = dy + 1) {
        poVar9 = poVar8->resolutions + dy;
        cVar1 = (char)dy;
        if (((poVar9->pdx + poVar8->numresolutions + -1) - dy < 0x20) &&
           (poVar8->dx <=
            (uint)(0xffffffff /
                  (ulong)(uint)(1 << (((char)poVar9->pdx + (char)poVar8->numresolutions + -1) -
                                      cVar1 & 0x1fU))))) {
          local_68 = poVar8->dx *
                     (1 << (((char)poVar9->pdx + (char)poVar8->numresolutions + -1) - cVar1 & 0x1fU)
                     );
          if (pi->dx != 0) {
            local_68 = opj_uint_min(pi->dx,local_68);
          }
          pi->dx = local_68;
        }
        if (((poVar9->pdy + poVar8->numresolutions + -1) - dy < 0x20) &&
           (poVar8->dy <=
            (uint)(0xffffffff /
                  (ulong)(uint)(1 << (((char)poVar9->pdy + (char)poVar8->numresolutions + -1) -
                                      cVar1 & 0x1fU))))) {
          local_70 = poVar8->dy *
                     (1 << (((char)poVar9->pdy + (char)poVar8->numresolutions + -1) - cVar1 & 0x1fU)
                     );
          if (pi->dy != 0) {
            local_70 = opj_uint_min(pi->dy,local_70);
          }
          pi->dy = local_70;
        }
      }
    }
    if ((pi->dx != 0) && (pi->dy != 0)) {
      if (pi->tp_on == '\0') {
        (pi->poc).ty0 = pi->ty0;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).ty1 = pi->ty1;
        (pi->poc).tx1 = pi->tx1;
      }
      pi->resno = (pi->poc).resno0;
      goto LAB_0013ab15;
    }
    pi_local._4_4_ = 0;
  }
  return pi_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_pi_next_rpcl(opj_pi_iterator_t * pi)
{
    opj_pi_comp_t *comp = NULL;
    opj_pi_resolution_t *res = NULL;
    OPJ_UINT32 index = 0;

    if (!pi->first) {
        goto LABEL_SKIP;
    } else {
        OPJ_UINT32 compno, resno;
        pi->first = 0;
        pi->dx = 0;
        pi->dy = 0;
        for (compno = 0; compno < pi->numcomps; compno++) {
            comp = &pi->comps[compno];
            for (resno = 0; resno < comp->numresolutions; resno++) {
                OPJ_UINT32 dx, dy;
                res = &comp->resolutions[resno];
                if (res->pdx + comp->numresolutions - 1 - resno < 32 &&
                        comp->dx <= UINT_MAX / (1u << (res->pdx + comp->numresolutions - 1 - resno))) {
                    dx = comp->dx * (1u << (res->pdx + comp->numresolutions - 1 - resno));
                    pi->dx = !pi->dx ? dx : opj_uint_min(pi->dx, dx);
                }
                if (res->pdy + comp->numresolutions - 1 - resno < 32 &&
                        comp->dy <= UINT_MAX / (1u << (res->pdy + comp->numresolutions - 1 - resno))) {
                    dy = comp->dy * (1u << (res->pdy + comp->numresolutions - 1 - resno));
                    pi->dy = !pi->dy ? dy : opj_uint_min(pi->dy, dy);
                }
            }
        }
        if (pi->dx == 0 || pi->dy == 0) {
            return OPJ_FALSE;
        }
    }
    if (!pi->tp_on) {
        pi->poc.ty0 = pi->ty0;
        pi->poc.tx0 = pi->tx0;
        pi->poc.ty1 = pi->ty1;
        pi->poc.tx1 = pi->tx1;
    }
    for (pi->resno = pi->poc.resno0; pi->resno < pi->poc.resno1; pi->resno++) {
        for (pi->y = pi->poc.ty0; pi->y < pi->poc.ty1;
                pi->y += (OPJ_INT32)(pi->dy - (OPJ_UINT32)(pi->y % (OPJ_INT32)pi->dy))) {
            for (pi->x = pi->poc.tx0; pi->x < pi->poc.tx1;
                    pi->x += (OPJ_INT32)(pi->dx - (OPJ_UINT32)(pi->x % (OPJ_INT32)pi->dx))) {
                for (pi->compno = pi->poc.compno0; pi->compno < pi->poc.compno1; pi->compno++) {
                    OPJ_UINT32 levelno;
                    OPJ_INT32 trx0, try0;
                    OPJ_INT32  trx1, try1;
                    OPJ_UINT32  rpx, rpy;
                    OPJ_INT32  prci, prcj;
                    comp = &pi->comps[pi->compno];
                    if (pi->resno >= comp->numresolutions) {
                        continue;
                    }
                    res = &comp->resolutions[pi->resno];
                    levelno = comp->numresolutions - 1 - pi->resno;
                    /* Avoids division by zero */
                    /* Relates to id_000004,sig_06,src_000679,op_arith8,pos_49,val_-17 */
                    /* of  https://github.com/uclouvain/openjpeg/issues/938 */
                    if (levelno >= 32 ||
                            ((comp->dx << levelno) >> levelno) != comp->dx ||
                            ((comp->dy << levelno) >> levelno) != comp->dy) {
                        continue;
                    }
                    if ((comp->dx << levelno) > INT_MAX ||
                            (comp->dy << levelno) > INT_MAX) {
                        continue;
                    }
                    trx0 = opj_int_ceildiv(pi->tx0, (OPJ_INT32)(comp->dx << levelno));
                    try0 = opj_int_ceildiv(pi->ty0, (OPJ_INT32)(comp->dy << levelno));
                    trx1 = opj_int_ceildiv(pi->tx1, (OPJ_INT32)(comp->dx << levelno));
                    try1 = opj_int_ceildiv(pi->ty1, (OPJ_INT32)(comp->dy << levelno));
                    rpx = res->pdx + levelno;
                    rpy = res->pdy + levelno;

                    /* To avoid divisions by zero / undefined behaviour on shift */
                    /* in below tests */
                    /* Fixes reading id:000026,sig:08,src:002419,op:int32,pos:60,val:+32 */
                    /* of https://github.com/uclouvain/openjpeg/issues/938 */
                    if (rpx >= 31 || ((comp->dx << rpx) >> rpx) != comp->dx ||
                            rpy >= 31 || ((comp->dy << rpy) >> rpy) != comp->dy) {
                        continue;
                    }

                    /* See ISO-15441. B.12.1.3 Resolution level-position-component-layer progression */
                    if (!((pi->y % (OPJ_INT32)(comp->dy << rpy) == 0) || ((pi->y == pi->ty0) &&
                            ((try0 << levelno) % (1 << rpy))))) {
                        continue;
                    }
                    if (!((pi->x % (OPJ_INT32)(comp->dx << rpx) == 0) || ((pi->x == pi->tx0) &&
                            ((trx0 << levelno) % (1 << rpx))))) {
                        continue;
                    }

                    if ((res->pw == 0) || (res->ph == 0)) {
                        continue;
                    }

                    if ((trx0 == trx1) || (try0 == try1)) {
                        continue;
                    }

                    prci = opj_int_floordivpow2(opj_int_ceildiv(pi->x,
                                                (OPJ_INT32)(comp->dx << levelno)), (OPJ_INT32)res->pdx)
                           - opj_int_floordivpow2(trx0, (OPJ_INT32)res->pdx);
                    prcj = opj_int_floordivpow2(opj_int_ceildiv(pi->y,
                                                (OPJ_INT32)(comp->dy << levelno)), (OPJ_INT32)res->pdy)
                           - opj_int_floordivpow2(try0, (OPJ_INT32)res->pdy);
                    pi->precno = (OPJ_UINT32)(prci + prcj * (OPJ_INT32)res->pw);
                    for (pi->layno = pi->poc.layno0; pi->layno < pi->poc.layno1; pi->layno++) {
                        index = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno *
                                pi->step_c + pi->precno * pi->step_p;
                        if (index >= pi->include_size) {
                            opj_pi_emit_error(pi, "Invalid access to pi->include");
                            return OPJ_FALSE;
                        }
                        if (!pi->include[index]) {
                            pi->include[index] = 1;
                            return OPJ_TRUE;
                        }
LABEL_SKIP:
                        ;
                    }
                }
            }
        }
    }

    return OPJ_FALSE;
}